

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  ImVec4 *pIVar5;
  ImGuiColorMod local_34;
  
  pIVar4 = GImGui;
  pIVar5 = (GImGui->Style).Colors + idx;
  local_34.BackupValue.x = pIVar5->x;
  local_34.BackupValue.y = pIVar5->y;
  local_34.BackupValue.z = pIVar5->z;
  local_34.BackupValue.w = pIVar5->w;
  local_34.Col = idx;
  ImVector<ImGuiColorMod>::push_back(&GImGui->ColorStack,&local_34);
  if (pIVar4->DebugFlashStyleColorIdx != idx) {
    pIVar5 = (pIVar4->Style).Colors + idx;
    fVar1 = col->y;
    fVar2 = col->z;
    fVar3 = col->w;
    pIVar5->x = col->x;
    pIVar5->y = fVar1;
    pIVar5 = (pIVar4->Style).Colors + idx;
    pIVar5->z = fVar2;
    pIVar5->w = fVar3;
  }
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    if (g.DebugFlashStyleColorIdx != idx)
        g.Style.Colors[idx] = col;
}